

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

void ScriptToUniv(CScript *script,UniValue *out,bool include_hex,bool include_address,
                 SigningProvider *provider)

{
  Span<const_unsigned_char> s;
  bool bVar1;
  TxoutType TVar2;
  pointer pDVar3;
  byte in_CL;
  byte in_DL;
  UniValue *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  TxoutType type;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solns;
  CTxDestination address;
  UniValue *in_stack_fffffffffffffbb8;
  CScript *in_stack_fffffffffffffbc0;
  Span<const_unsigned_char> *in_stack_fffffffffffffbc8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this;
  SigningProvider *in_stack_fffffffffffffbd0;
  CScript *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  TxoutType TVar4;
  UniValue *in_stack_fffffffffffffbf8;
  UniValue *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc18;
  undefined1 fAttemptSighashDecode;
  CScript *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc40;
  TxoutType in_stack_fffffffffffffc44;
  undefined1 local_392 [49];
  allocator<char> local_361;
  CTxDestination *in_stack_fffffffffffffca0;
  CScript *in_stack_fffffffffffffca8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffce0;
  CScript *in_stack_fffffffffffffce8;
  undefined1 local_188 [384];
  long local_8;
  
  fAttemptSighashDecode = (undefined1)((ulong)in_stack_fffffffffffffc18 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffffbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (allocator<char> *)in_stack_fffffffffffffbf8);
  ScriptToAsmStr_abi_cxx11_(in_stack_fffffffffffffc20,(bool)fAttemptSighashDecode);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbf8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  UniValue::pushKV(in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                   (UniValue *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  UniValue::~UniValue(in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcaf);
  if ((in_CL & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
               (allocator<char> *)in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffc08 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)DUMMY_SIGNING_PROVIDER
    ;
    if (in_R8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      in_stack_fffffffffffffc08 = in_R8;
    }
    InferDescriptor(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    pDVar3 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_fffffffffffffbb8);
    (*pDVar3->_vptr_Descriptor[4])(local_188,pDVar3,0);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffbf8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    UniValue::pushKV(in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                     (UniValue *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    UniValue::~UniValue(in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb8);
    std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
              ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)in_stack_fffffffffffffbc8
              );
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcae);
  }
  if ((in_DL & 1) != 0) {
    in_stack_fffffffffffffc00 = (UniValue *)&local_361;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,(allocator<char> *)in_RSI
              );
    Span<const_unsigned_char>::Span<CScript>
              (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    s.m_data._4_4_ = in_stack_fffffffffffffc44;
    s.m_data._0_4_ = in_stack_fffffffffffffc40;
    s.m_size = (size_t)in_R8;
    HexStr_abi_cxx11_(s);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    UniValue::pushKV(in_stack_fffffffffffffc00,(string *)in_RSI,
                     (UniValue *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    UniValue::~UniValue(in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb8);
    std::allocator<char>::~allocator(&local_361);
    in_stack_fffffffffffffbf8 = in_RSI;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffffbb8);
  TVar2 = Solver(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  TVar4 = TVar2;
  if ((((in_CL & 1) != 0) &&
      (bVar1 = ExtractDestination(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0), bVar1)) &&
     (TVar2 != PUBKEY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
               (allocator<char> *)in_stack_fffffffffffffbf8);
    EncodeDestination_abi_cxx11_((CTxDestination *)in_stack_fffffffffffffbc8);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffbf8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(TVar4,in_stack_fffffffffffffbf0));
    UniValue::pushKV(in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                     (UniValue *)CONCAT44(TVar4,in_stack_fffffffffffffbf0));
    UniValue::~UniValue(in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbb8);
    std::allocator<char>::~allocator((allocator<char> *)(local_392 + 1));
  }
  this = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)local_392;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00,
             (allocator<char> *)in_stack_fffffffffffffbf8);
  GetTxnOutputType_abi_cxx11_(in_stack_fffffffffffffc44);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbf8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(TVar4,in_stack_fffffffffffffbf0));
  UniValue::pushKV(in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,
                   (UniValue *)CONCAT44(TVar4,in_stack_fffffffffffffbf0));
  UniValue::~UniValue(in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbb8);
  std::allocator<char>::~allocator((allocator<char> *)local_392);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(this);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffbb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ScriptToUniv(const CScript& script, UniValue& out, bool include_hex, bool include_address, const SigningProvider* provider)
{
    CTxDestination address;

    out.pushKV("asm", ScriptToAsmStr(script));
    if (include_address) {
        out.pushKV("desc", InferDescriptor(script, provider ? *provider : DUMMY_SIGNING_PROVIDER)->ToString());
    }
    if (include_hex) {
        out.pushKV("hex", HexStr(script));
    }

    std::vector<std::vector<unsigned char>> solns;
    const TxoutType type{Solver(script, solns)};

    if (include_address && ExtractDestination(script, address) && type != TxoutType::PUBKEY) {
        out.pushKV("address", EncodeDestination(address));
    }
    out.pushKV("type", GetTxnOutputType(type));
}